

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O0

ssize_t __thiscall
ezc3d::DataNS::Points3dNS::Point::write(Point *this,int __fd,void *__buf,size_t __n)

{
  const_reference cVar1;
  int iVar2;
  undefined4 extraout_var;
  const_reference pvVar3;
  size_type sVar4;
  ssize_t sVar5;
  undefined4 in_register_00000034;
  double extraout_XMM0_Qa;
  int minusOne;
  float zero;
  int residual;
  size_t cameraMasks;
  size_t i_1;
  bitset<8UL> cameraMasksBits;
  float data;
  size_t i;
  ulong uVar6;
  undefined1 __x;
  reference *this_00;
  undefined4 local_7c;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff90;
  reference local_68;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffb0;
  reference local_48;
  ulong local_38;
  float local_24;
  reference *local_20;
  long local_10;
  Point *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  (*(this->super_Vector3d).super_Matrix._vptr_Matrix[0x28])();
  if (extraout_XMM0_Qa < 0.0) {
    local_7c = 0xffffbf80;
    std::ostream::write((char *)(local_10 + 0x10),(long)&stack0xffffffffffffff88);
    std::ostream::write((char *)(local_10 + 0x10),(long)&stack0xffffffffffffff88);
    std::ostream::write((char *)(local_10 + 0x10),(long)&stack0xffffffffffffff88);
    std::ostream::write((char *)(local_10 + 0x10),(long)&stack0xffffffffffffff88);
    sVar5 = std::ostream::write((char *)(local_10 + 0x10),(long)&local_7c);
  }
  else {
    local_20 = (reference *)0x0;
    while( true ) {
      this_00 = local_20;
      iVar2 = (*(this->super_Vector3d).super_Matrix._vptr_Matrix[5])();
      if ((reference *)CONCAT44(extraout_var,iVar2) <= this_00) break;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(this->super_Vector3d).super_Matrix._data,(size_type)local_20);
      local_24 = (float)*pvVar3;
      std::ostream::write((char *)(local_10 + 0x10),(long)&local_24);
      local_20 = (reference *)((long)&local_20->_M_wp + 1);
    }
    std::bitset<8UL>::bitset((bitset<8UL> *)0x1777e4);
    local_38 = 0;
    while( true ) {
      uVar6 = local_38;
      sVar4 = std::vector<bool,_std::allocator<bool>_>::size(in_stack_ffffffffffffffb0);
      if (sVar4 <= uVar6) break;
      cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (in_stack_ffffffffffffff90,
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      __x = (undefined1)(uVar6 >> 0x38);
      if (cVar1) {
        std::bitset<8UL>::operator[]((bitset<8UL> *)this,(size_t)this_00);
        std::bitset<8UL>::reference::operator=(this_00,(bool)__x);
        std::bitset<8UL>::reference::~reference(&local_48);
      }
      else {
        std::bitset<8UL>::operator[]((bitset<8UL> *)this,(size_t)this_00);
        std::bitset<8UL>::reference::operator=(this_00,(bool)__x);
        std::bitset<8UL>::reference::~reference((reference *)&stack0xffffffffffffffa8);
      }
      local_38 = local_38 + 1;
    }
    std::bitset<8UL>::operator[]((bitset<8UL> *)this,(size_t)this_00);
    std::bitset<8UL>::reference::operator=(this_00,SUB81(uVar6 >> 0x38,0));
    std::bitset<8UL>::reference::~reference(&local_68);
    std::bitset<8UL>::to_ulong((bitset<8UL> *)0x1778cf);
    std::ostream::write((char *)(local_10 + 0x10),(long)&stack0xffffffffffffff90);
    sVar5 = std::ostream::write((char *)(local_10 + 0x10),(long)&stack0xffffffffffffff8c);
  }
  return sVar5;
}

Assistant:

void ezc3d::DataNS::Points3dNS::Point::write(std::fstream &f,
                                             float scaleFactor) const {
  if (residual() >= 0) {
    for (size_t i = 0; i < size(); ++i) {
      float data(static_cast<float>(_data[i]));
      f.write(reinterpret_cast<const char *>(&data), ezc3d::DATA_TYPE::FLOAT);
    }
    std::bitset<8> cameraMasksBits;
    for (size_t i = 0; i < _cameraMasks.size(); ++i) {
      if (_cameraMasks[i]) {
        cameraMasksBits[i] = 1;
      } else {
        cameraMasksBits[i] = 0;
      }
    }
    cameraMasksBits[7] = 0;
    size_t cameraMasks(cameraMasksBits.to_ulong());
    f.write(reinterpret_cast<const char *>(&cameraMasks),
            ezc3d::DATA_TYPE::WORD);
    int residual(static_cast<int>(_residual / fabsf(scaleFactor)));
    f.write(reinterpret_cast<const char *>(&residual), ezc3d::DATA_TYPE::WORD);
  } else {
    float zero(0);
    int minusOne(-16512); // 0xbf80 - 0xFFFF - 1   This is the Qualisys and
                          // Vicon value for missing marker);
    f.write(reinterpret_cast<const char *>(&zero), ezc3d::DATA_TYPE::FLOAT);
    f.write(reinterpret_cast<const char *>(&zero), ezc3d::DATA_TYPE::FLOAT);
    f.write(reinterpret_cast<const char *>(&zero), ezc3d::DATA_TYPE::FLOAT);
    f.write(reinterpret_cast<const char *>(&zero), ezc3d::DATA_TYPE::WORD);
    f.write(reinterpret_cast<const char *>(&minusOne), ezc3d::DATA_TYPE::WORD);
  }
}